

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix22<float> * __thiscall
Imath_3_2::Matrix22<float>::setRotation<float>(Matrix22<float> *this,float r)

{
  Matrix22<float> *in_RDI;
  uint in_XMM0_Da;
  double dVar1;
  double dVar2;
  float sin_r;
  float cos_r;
  
  dVar1 = std::cos((double)(ulong)in_XMM0_Da);
  dVar2 = std::sin((double)(ulong)in_XMM0_Da);
  in_RDI->x[0][0] = SUB84(dVar1,0);
  in_RDI->x[0][1] = SUB84(dVar2,0);
  in_RDI->x[1][0] = -SUB84(dVar2,0);
  in_RDI->x[1][1] = SUB84(dVar1,0);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline const Matrix22<T>&
Matrix22<T>::setRotation (S r) IMATH_NOEXCEPT
{
    S cos_r, sin_r;

    cos_r = cos ((T) r);
    sin_r = sin ((T) r);

    x[0][0] = cos_r;
    x[0][1] = sin_r;

    x[1][0] = -sin_r;
    x[1][1] = cos_r;

    return *this;
}